

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O3

Format * __thiscall
google::protobuf::io::Printer::TokenizeFormat
          (Format *__return_storage_ptr__,Printer *this,string_view format_string,
          PrintOptions *options)

{
  pointer *ppCVar1;
  undefined2 uVar2;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  iterator __position;
  pointer pCVar3;
  size_t sVar4;
  int *piVar5;
  iterator __position_00;
  undefined1 uVar11;
  pointer pCVar12;
  char *pcVar13;
  size_t sVar14;
  void *pvVar15;
  lts_20250127 *plVar16;
  size_t sVar17;
  pointer pLVar18;
  lts_20250127 *plVar19;
  pointer pCVar20;
  char *extraout_RDX;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *extraout_RDX_00;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *pSVar21;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *extraout_RDX_01;
  bool bVar22;
  size_type __n;
  lts_20250127 *plVar23;
  lts_20250127 *plVar24;
  bool bVar25;
  pointer pLVar26;
  pointer pLVar27;
  string_view sVar28;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  message;
  PrintOptions opts;
  const_iterator __begin3;
  const_iterator __begin2;
  basic_string_view<char,_std::char_traits<char>_> local_118;
  lts_20250127 *local_100;
  pointer local_f8;
  lts_20250127 *local_f0;
  Printer *local_e8;
  SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_e0;
  PrintOptions *local_b0;
  Chunk local_a8;
  SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_90;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_60;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_48;
  
  pLVar27 = (pointer)format_string._M_str;
  plVar24 = (lts_20250127 *)format_string._M_len;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->lines).
           super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->lines).
           super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (__return_storage_ptr__->lines).
  super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->lines).
  super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8 = this;
  local_b0 = options;
  if (options->strip_raw_string_indentation != true) {
    local_100 = (lts_20250127 *)0x0;
    local_48.text_._M_len = (size_t)plVar24;
    local_48.text_._M_str = (char *)pLVar27;
    goto LAB_00450727;
  }
  plVar23 = plVar24;
  pLVar18 = pLVar27;
  if (plVar24 == (lts_20250127 *)0x0) {
LAB_004506f1:
    __return_storage_ptr__->is_raw_string = false;
    local_100 = (lts_20250127 *)0x0;
    pLVar26 = pLVar18;
    plVar19 = plVar23;
  }
  else {
    local_100 = (lts_20250127 *)0x0;
    plVar19 = (lts_20250127 *)0x0;
    pLVar26 = (pointer)0x0;
    local_f8 = pLVar27;
    local_f0 = plVar24;
    do {
      while( true ) {
        if (*(char *)&(pLVar27->chunks).
                      super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                      ._M_impl.super__Vector_impl_data._M_start != '\n') goto LAB_004506d0;
        pLVar18 = (pointer)((long)&(pLVar27->chunks).
                                   super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1);
        plVar23 = plVar24 + -1;
        if (plVar23 == (lts_20250127 *)0x0) {
          __return_storage_ptr__->is_raw_string = true;
          local_100 = (lts_20250127 *)0x0;
          plVar24 = (lts_20250127 *)0x0;
          pLVar27 = pLVar18;
          goto LAB_004506d0;
        }
        if (*(char *)&(pLVar18->chunks).
                      super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                      ._M_impl.super__Vector_impl_data._M_start == '#') break;
LAB_0045066b:
        __return_storage_ptr__->is_raw_string = true;
        local_100 = (lts_20250127 *)0x0;
        while (((undefined1 *)
               ((long)&(pLVar27->chunks).
                       super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1))[(long)local_100] == ' ') {
          local_100 = local_100 + 1;
          if (plVar24 + -1 == local_100) {
            pLVar27 = (pointer)(plVar24 + (long)&pLVar27->chunks);
            plVar24 = (lts_20250127 *)0x0;
            local_100 = plVar23;
            goto LAB_004506d0;
          }
        }
        pLVar27 = (pointer)(local_100 +
                           (long)((long)&(pLVar27->chunks).
                                         super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 1));
        plVar24 = plVar24 + ~(ulong)local_100;
      }
      if (plVar19 == (lts_20250127 *)0x0) {
        plVar19 = plVar23;
        pLVar26 = pLVar18;
      }
      pvVar15 = memchr(pLVar18,10,(size_t)plVar23);
      if ((pvVar15 == (void *)0x0) ||
         (plVar16 = (lts_20250127 *)((long)pvVar15 - (long)pLVar18),
         plVar16 == (lts_20250127 *)0xffffffffffffffff)) goto LAB_0045066b;
      if (plVar23 < plVar16) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   plVar16,plVar23);
      }
      pLVar27 = (pointer)((long)pLVar18 + (long)plVar16);
      plVar24 = plVar23 + -(long)plVar16;
    } while (plVar24 != (lts_20250127 *)0x0);
    plVar24 = (lts_20250127 *)0x0;
LAB_004506d0:
    plVar23 = local_f0;
    pLVar18 = local_f8;
    if ((plVar19 == (lts_20250127 *)0x0) &&
       (pLVar26 = pLVar27, plVar19 = plVar24, plVar24 == (lts_20250127 *)0x0)) goto LAB_004506f1;
  }
  local_48.text_._M_len = (size_t)plVar19;
  local_48.text_._M_str = (char *)pLVar26;
  if (((local_e8->at_start_of_line_ == false) && (plVar19 != (lts_20250127 *)0x0)) &&
     (local_48.text_._M_len = (size_t)plVar23, local_48.text_._M_str = (char *)pLVar18,
     *(char *)&(pLVar26->chunks).
               super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
               ._M_impl.super__Vector_impl_data._M_start != '#')) {
    local_48.text_._M_len = (size_t)plVar19;
    local_48.text_._M_str = (char *)pLVar26;
  }
LAB_00450727:
  local_90.splitter_ = &local_48;
  local_48.delimiter_.c_ = '\n';
  local_90.pos_ = 0;
  local_90.state_ = kInitState;
  local_90.curr_._M_len = 0;
  local_90.curr_._M_str = (char *)0x0;
  local_90.delimiter_.c_ = '\n';
  if ((pointer)local_48.text_._M_str == (pointer)0x0) {
    local_90.state_ = kEndState;
    local_90.pos_ = local_48.text_._M_len;
  }
  else {
    absl::lts_20250127::strings_internal::
    SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::operator++(&local_90);
  }
  bVar22 = true;
  local_f0 = (lts_20250127 *)local_48.text_._M_len;
  do {
    if ((local_90.state_ == kEndState) && ((lts_20250127 *)local_90.pos_ == local_f0)) {
      if (__return_storage_ptr__->is_raw_string == true) {
        pLVar18 = (__return_storage_ptr__->lines).
                  super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pLVar27 = (__return_storage_ptr__->lines).
                  super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (pLVar18 != pLVar27) {
          do {
            pCVar3 = pLVar27[-1].chunks.
                     super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (pCVar3 != pLVar27[-1].chunks.
                          super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                          ._M_impl.super__Vector_impl_data._M_finish) {
              return __return_storage_ptr__;
            }
            (__return_storage_ptr__->lines).
            super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
            ._M_impl.super__Vector_impl_data._M_finish = pLVar27 + -1;
            pLVar26 = pLVar27 + -1;
            if (pCVar3 != (pointer)0x0) {
              operator_delete(pCVar3,(long)pLVar27[-1].chunks.
                                           super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                     (long)pCVar3);
              pLVar18 = (__return_storage_ptr__->lines).
                        super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pLVar26 = (__return_storage_ptr__->lines).
                        super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            }
            pLVar27 = pLVar26;
          } while (pLVar18 != pLVar27);
        }
      }
      return __return_storage_ptr__;
    }
    local_118._M_len = local_90.curr_._M_len;
    local_118._M_str = local_90.curr_._M_str;
    if ((__return_storage_ptr__->is_raw_string == true) &&
       (plVar24 = (lts_20250127 *)
                  std::basic_string_view<char,_std::char_traits<char>_>::find
                            (&local_118,(local_e8->options_).ignored_comment_start._M_str,0,
                             (local_e8->options_).ignored_comment_start._M_len),
       plVar24 != (lts_20250127 *)0xffffffffffffffff)) {
      if (local_118._M_len < plVar24) {
        plVar24 = (lts_20250127 *)local_118._M_len;
      }
      sVar28._M_str = extraout_RDX;
      sVar28._M_len = (size_t)local_118._M_str;
      local_118._M_len = (size_t)plVar24;
      sVar28 = absl::lts_20250127::StripLeadingAsciiWhitespace(plVar24,sVar28);
      if (sVar28._M_len != 0) goto LAB_0045082a;
    }
    else {
LAB_0045082a:
      pcVar13 = local_118._M_str;
      sVar17 = local_118._M_len;
      if (bVar22) {
        plVar24 = (lts_20250127 *)0x0;
      }
      else {
        plVar24 = (lts_20250127 *)sVar17;
        if ((lts_20250127 *)local_118._M_len != (lts_20250127 *)0x0) {
          plVar23 = (lts_20250127 *)0x0;
          do {
            plVar19 = (lts_20250127 *)(local_118._M_len + -1);
            plVar24 = plVar23;
            if (pcVar13[(long)plVar23] != ' ') break;
            local_118._M_str = pcVar13 + (long)plVar23 + 1;
            plVar23 = plVar23 + 1;
            plVar24 = (lts_20250127 *)sVar17;
            local_118._M_len = (size_t)plVar19;
          } while (plVar19 != (lts_20250127 *)0x0);
        }
      }
      __position._M_current =
           (__return_storage_ptr__->lines).
           super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->lines).
          super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
        ::_M_realloc_insert<>(&__return_storage_ptr__->lines,__position);
        pLVar27 = (__return_storage_ptr__->lines).
                  super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        ((__position._M_current)->chunks).
        super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (__position._M_current)->indent = 0;
        ((__position._M_current)->chunks).
        super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        ((__position._M_current)->chunks).
        super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        pLVar27 = (__return_storage_ptr__->lines).
                  super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
                  ._M_impl.super__Vector_impl_data._M_finish + 1;
        (__return_storage_ptr__->lines).
        super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
        ._M_impl.super__Vector_impl_data._M_finish = pLVar27;
      }
      sVar17 = 0;
      if (local_100 <= plVar24) {
        sVar17 = (long)plVar24 - (long)local_100;
      }
      pLVar27[-1].indent = sVar17;
      local_e0.delimiter_.c_ = (local_e8->options_).variable_delimiter;
      local_60.text_._M_len = local_118._M_len;
      local_60.text_._M_str = local_118._M_str;
      local_e0.pos_ = 0;
      local_e0.state_ = kInitState;
      local_e0.curr_._M_len = 0;
      local_e0.curr_._M_str = (char *)0x0;
      pSVar21 = &local_60;
      local_e0.splitter_ = pSVar21;
      local_60.delimiter_.c_ = local_e0.delimiter_.c_;
      if (local_118._M_str == (char *)0x0) {
        local_e0.state_ = kEndState;
        local_e0.pos_ = local_118._M_len;
      }
      else {
        absl::lts_20250127::strings_internal::
        SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::operator++(&local_e0);
        pSVar21 = extraout_RDX_00;
      }
      sVar17 = local_60.text_._M_len;
      local_f8 = pLVar27 + -1;
      plVar24 = (lts_20250127 *)0x0;
      bVar22 = false;
      while ((sVar14 = local_e0.curr_._M_len, local_e0.state_ != kEndState ||
             (local_e0.pos_ != sVar17))) {
        pCVar3 = pLVar27[-1].chunks.
                 super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        bVar25 = bVar22;
        if (pLVar27[-1].chunks.
            super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
            ._M_impl.super__Vector_impl_data._M_start == pCVar3) {
LAB_004509a7:
          if (local_e0.curr_._M_len != 0 || bVar25 != false) {
LAB_004509b5:
            local_a8.text._M_len = local_e0.curr_._M_len;
            local_a8.text._M_str = local_e0.curr_._M_str;
            __position_00._M_current =
                 pLVar27[-1].chunks.
                 super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_a8.is_var = bVar22;
            if (__position_00._M_current ==
                pLVar27[-1].chunks.
                super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
              ::_M_realloc_insert<google::protobuf::io::Printer::Format::Chunk>
                        (&local_f8->chunks,__position_00,&local_a8);
            }
            else {
              *(ulong *)&(__position_00._M_current)->is_var = CONCAT71(local_a8._17_7_,bVar22);
              ((__position_00._M_current)->text)._M_len = local_e0.curr_._M_len;
              ((__position_00._M_current)->text)._M_str = local_e0.curr_._M_str;
              ppCVar1 = &pLVar27[-1].chunks.
                         super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppCVar1 = *ppCVar1 + 1;
            }
          }
          sVar4 = sVar14 + 2;
          if (bVar25 == false) {
            sVar4 = sVar14;
          }
          bVar22 = (bool)(bVar22 ^ 1);
        }
        else {
          bVar25 = true;
          if (bVar22 != false) goto LAB_004509b5;
          sVar4 = pCVar3[-1].text._M_len;
          piVar5 = (int *)pCVar3[-1].text._M_str;
          if (sVar4 == 4) {
            if (*piVar5 != 0x646e655f) goto LAB_0045099f;
          }
          else if ((sVar4 != 6) || ((short)piVar5[1] != 0x7472 || *piVar5 != 0x6174735f)) {
LAB_0045099f:
            bVar25 = false;
            goto LAB_004509a7;
          }
          pCVar3[-1].text._M_len = sVar4 + local_e0.curr_._M_len + 1;
          sVar4 = local_e0.curr_._M_len + 1;
        }
        plVar24 = plVar24 + sVar4;
        absl::lts_20250127::strings_internal::
        SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::operator++(&local_e0);
        pSVar21 = extraout_RDX_01;
      }
      uVar2 = local_b0->loc;
      uVar6 = local_b0->checks_are_debug_only;
      uVar7 = local_b0->use_substitution_map;
      uVar8 = local_b0->use_curly_brace_substitutions;
      uVar9 = local_b0->allow_digit_substitutions;
      uVar10 = local_b0->strip_spaces_around_vars;
      uVar11 = local_b0->strip_raw_string_indentation;
      opts.strip_raw_string_indentation = (bool)uVar11;
      opts.strip_spaces_around_vars = (bool)uVar10;
      opts.allow_digit_substitutions = (bool)uVar9;
      opts.use_curly_brace_substitutions = (bool)uVar8;
      opts.use_substitution_map = (bool)uVar7;
      opts.checks_are_debug_only = (bool)uVar6;
      opts.loc.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
      _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
           (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
           (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)uVar2;
      local_e0.pos_ = (size_t)local_f8;
      message.invoker_ =
           absl::lts_20250127::functional_internal::
           InvokeObject<google::protobuf::io::Printer::TokenizeFormat(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::io::Printer::PrintOptions_const&)::__0,std::__cxx11::string>
      ;
      message.ptr_.obj = &local_e0;
      opts.use_annotation_frames = SUB81(pSVar21,0);
      Validate(plVar24 == (lts_20250127 *)local_118._M_len,opts,message);
      pCVar3 = pLVar27[-1].chunks.
               super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pCVar12 = pLVar27[-1].chunks.
                super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      while (((pCVar3 != pCVar12 && (pCVar20 = pCVar12 + -1, pCVar12[-1].is_var == false)) &&
             ((pCVar20->text)._M_len == 0))) {
        pLVar27[-1].chunks.
        super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
        ._M_impl.super__Vector_impl_data._M_finish = pCVar20;
        pCVar12 = pCVar20;
      }
    }
    bVar22 = false;
    absl::lts_20250127::strings_internal::
    SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::operator++(&local_90);
  } while( true );
}

Assistant:

Printer::Format Printer::TokenizeFormat(absl::string_view format_string,
                                        const PrintOptions& options) {
  Format format;
  size_t raw_string_indent = 0;
  if (options.strip_raw_string_indentation) {
    // We are processing a call that looks like
    //
    // p->Emit(R"cc(
    //   class Foo {
    //     int x, y, z;
    //   };
    // )cc");
    //
    // or
    //
    // p->Emit(R"cc(
    //
    //   class Foo {
    //     int x, y, z;
    //   };
    // )cc");
    //
    // To compute the indent, we need:
    //   1. Iterate over each line.
    //   2. Find the first line that contains non-whitespace characters.
    //   3. Count the number of leading spaces on that line.
    //
    // The following pairs of loops assume the current line is the first line
    // with non-whitespace characters; if we consume all the spaces and
    // then immediately hit a newline, this means this wasn't the right line and
    // we should start over.
    //
    // Note that the very first character *must* be a newline; that is how we
    // detect that this is a multi-line raw string template, and as such this is
    // a while loop, not a do/while loop.

    absl::string_view orig = format_string;
    absl::string_view first_pp_directive;
    while (absl::ConsumePrefix(&format_string, "\n")) {
      // clang-format will think a # at the beginning of the line in a raw
      // string is a preprocessor directive and put it at the start of the line,
      // which throws off indent calculation. Skip past those to find code that
      // is indented more realistically.
      if (absl::StartsWith(format_string, "#")) {
        // We don't want to drop the first #... lines. We just want to skip
        // through here. Remember to allow resetting later.
        if (first_pp_directive.empty()) {
          first_pp_directive = format_string;
        }
        size_t next_newline_index = format_string.find('\n');
        if (next_newline_index != absl::string_view::npos) {
          format_string = format_string.substr(next_newline_index);
          continue;
        }
      }
      raw_string_indent = 0;
      format.is_raw_string = true;
      while (absl::ConsumePrefix(&format_string, " ")) {
        ++raw_string_indent;
      }
    }
    // Reset if we skipped through some #... lines, so that we don't drop them.
    if (!first_pp_directive.empty()) {
      format_string = first_pp_directive;
    }

    // If we consume the entire string, this probably wasn't a raw string and
    // was probably something like a couple of explicit newlines.
    if (format_string.empty()) {
      format_string = orig;
      format.is_raw_string = false;
      raw_string_indent = 0;
    }

    // This means we have a preprocessor directive and we should not have eaten
    // the newline.
    if (!at_start_of_line_ && absl::StartsWith(format_string, "#")) {
      format_string = orig;
    }
  }

  // We now split the remaining format string into lines and discard:
  //   1. A trailing Printer-discarded comment, if this is a raw string.
  //
  //   2. All leading spaces to compute that line's indent.
  //      We do not do this for the first line, so that Emit("  ") works
  //      correctly. We do this *regardless* of whether we are processing
  //      a raw string, because existing non-raw-string calls to cpp::Formatter
  //      rely on this. There is a test that validates this behavior.
  //
  //   3. Set the indent for that line to max(0, line_indent -
  //      raw_string_indent), if this is not a raw string.
  //
  //   4. Trailing empty lines, if we know this is a raw string, except for
  //      a single extra newline at the end.
  //
  // Each line is itself split into chunks along the variable delimiters, e.g.
  // $...$.
  bool is_first = true;
  for (absl::string_view line_text : absl::StrSplit(format_string, '\n')) {
    if (format.is_raw_string) {
      size_t comment_index = line_text.find(options_.ignored_comment_start);
      if (comment_index != absl::string_view::npos) {
        line_text = line_text.substr(0, comment_index);
        if (absl::StripLeadingAsciiWhitespace(line_text).empty()) {
          // If the first line is part of an ignored comment, consider that a
          // first line as well.
          is_first = false;
          continue;
        }
      }
    }

    size_t line_indent = 0;
    while (!is_first && absl::ConsumePrefix(&line_text, " ")) {
      ++line_indent;
    }
    is_first = false;

    format.lines.emplace_back();
    auto& line = format.lines.back();
    line.indent =
        line_indent > raw_string_indent ? line_indent - raw_string_indent : 0;

    bool is_var = false;
    size_t total_len = 0;
    for (absl::string_view chunk :
         absl::StrSplit(line_text, options_.variable_delimiter)) {
      // The special _start and _end variables should actually glom the next
      // chunk into themselves, so as to be of the form _start$foo and _end$foo.
      if (!line.chunks.empty() && !is_var) {
        auto& prev = line.chunks.back();
        if (prev.text == "_start" || prev.text == "_end") {
          // The +1 below is to account for the $ in between them.
          // This string is safe, because prev.text and chunk are contiguous
          // by construction.
          prev.text = absl::string_view(prev.text.data(),
                                        prev.text.size() + 1 + chunk.size());

          // Account for the foo$ part of $_start$foo$.
          total_len += chunk.size() + 1;
          continue;
        }
      }

      if (is_var || !chunk.empty()) {
        line.chunks.push_back(Format::Chunk{chunk, is_var});
      }

      total_len += chunk.size();
      if (is_var) {
        // This accounts for the $s around a variable.
        total_len += 2;
      }

      is_var = !is_var;
    }

    // To ensure there are no unclosed $...$, we check that the computed length
    // above equals the actual length of the string. If it's off, that means
    // that there are missing or extra $ characters.
    Validate(total_len == line_text.size(), options, [&line] {
      if (line.chunks.empty()) {
        return std::string("wrong number of variable delimiters");
      }

      return absl::StrFormat("unclosed variable name: `%s`",
                             absl::CHexEscape(line.chunks.back().text));
    });

    // Trim any empty, non-variable chunks.
    while (!line.chunks.empty()) {
      auto& last = line.chunks.back();
      if (last.is_var || !last.text.empty()) {
        break;
      }

      line.chunks.pop_back();
    }
  }

  // Discard any trailing newlines (i.e., lines which contain no chunks.)
  if (format.is_raw_string) {
    while (!format.lines.empty() && format.lines.back().chunks.empty()) {
      format.lines.pop_back();
    }
  }

#if 0  // Use this to aid debugging tokenization.
  LOG(INFO) << "--- " << format.lines.size() << " lines";
  for (size_t i = 0; i < format.lines.size(); ++i) {
    const auto& line = format.lines[i];

    auto log_line = absl::StrFormat("[\" \" x %d]", line.indent);
    for (const auto& chunk : line.chunks) {
      absl::StrAppendFormat(&log_line, " %s\"%s\"", chunk.is_var ? "$" : "",
                            absl::CHexEscape(chunk.text));
    }
    LOG(INFO) << log_line;
  }
  LOG(INFO) << "---";
#endif

  return format;
}